

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

void Cba_ManWriteConcat(Cba_Ntk_t *p,int iObj)

{
  int iVar1;
  Vec_Str_t *p_00;
  char *pStr;
  Vec_Str_t *vStr;
  int iFon;
  int iFin;
  int i;
  int iObj_local;
  Cba_Ntk_t *p_local;
  
  p_00 = &p->pDesign->vOut;
  iVar1 = Cba_ObjIsConcat(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("Cba_ObjIsConcat(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaWriteVer.c"
                  ,0x1ae,"void Cba_ManWriteConcat(Cba_Ntk_t *, int)");
  }
  Vec_StrPush(p_00,'{');
  iFon = 0;
  for (vStr._4_4_ = Cba_ObjFin0(p,iObj); iVar1 = Cba_ObjFin0(p,iObj + 1), vStr._4_4_ < iVar1;
      vStr._4_4_ = vStr._4_4_ + 1) {
    iVar1 = Cba_FinFon(p,vStr._4_4_);
    pStr = "";
    if (iFon != 0) {
      pStr = ", ";
    }
    Vec_StrPrintStr(p_00,pStr);
    Cba_ManWriteFonName(p,iVar1,1,0);
    iFon = iFon + 1;
  }
  Vec_StrPush(p_00,'}');
  return;
}

Assistant:

void Cba_ManWriteConcat( Cba_Ntk_t * p, int iObj )
{
    int i, iFin, iFon;
    Vec_Str_t * vStr = &p->pDesign->vOut;
    assert( Cba_ObjIsConcat(p, iObj) );
    Vec_StrPush( vStr, '{' );
    Cba_ObjForEachFinFon( p, iObj, iFin, iFon, i )
    {
        Vec_StrPrintStr( vStr, i ? ", " : "" );
        Cba_ManWriteFonName( p, iFon, 1, 0 );
    }
    Vec_StrPush( vStr, '}' );
}